

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mat_pixel.cpp
# Opt level: O1

Mat * ncnn::Mat::from_pixels_resize
                (Mat *__return_storage_ptr__,uchar *pixels,int type,int w,int h,int target_width,
                int target_height,Allocator *allocator)

{
  int stride;
  
  if ((type & 0xffffU) - 1 < 2) {
    stride = w * 3;
  }
  else if ((short)type == 4) {
    stride = w * 4;
  }
  else {
    stride = w;
    if ((type & 0xffffU) != 3) {
      *(undefined8 *)((long)&__return_storage_ptr__->refcount + 4) = 0;
      *(undefined8 *)((long)&__return_storage_ptr__->elemsize + 4) = 0;
      __return_storage_ptr__->data = (void *)0x0;
      __return_storage_ptr__->refcount = (int *)0x0;
      __return_storage_ptr__->allocator = (Allocator *)0x0;
      __return_storage_ptr__->dims = 0;
      __return_storage_ptr__->w = 0;
      __return_storage_ptr__->h = 0;
      __return_storage_ptr__->c = 0;
      __return_storage_ptr__->cstep = 0;
      return __return_storage_ptr__;
    }
  }
  from_pixels_resize(__return_storage_ptr__,pixels,type,w,h,stride,target_width,target_height,
                     allocator);
  return __return_storage_ptr__;
}

Assistant:

Mat Mat::from_pixels_resize(const unsigned char* pixels, int type, int w, int h, int target_width, int target_height, Allocator* allocator)
{
    int type_from = type & PIXEL_FORMAT_MASK;

    if (type_from == PIXEL_RGB || type_from == PIXEL_BGR)
    {
        return Mat::from_pixels_resize(pixels, type, w, h, w * 3, target_width, target_height, allocator);
    }
    else if (type_from == PIXEL_GRAY)
    {
        return Mat::from_pixels_resize(pixels, type, w, h, w * 1, target_width, target_height, allocator);
    }
    else if (type_from == PIXEL_RGBA)
    {
        return Mat::from_pixels_resize(pixels, type, w, h, w * 4, target_width, target_height, allocator);
    }

    // unknown convert type
    return Mat();
}